

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thriftl.cc
# Opt level: O2

yy_state_type yy_get_previous_state(void)

{
  uint uVar1;
  byte *pbVar2;
  byte bVar3;
  long lVar4;
  
  uVar1 = (uint)yy_start;
  pbVar2 = (byte *)yytext_ptr;
LAB_002ca18d:
  if (yy_c_buf_p <= pbVar2) {
    return uVar1;
  }
  if ((ulong)*pbVar2 == 0) {
    bVar3 = 1;
  }
  else {
    bVar3 = ""[*pbVar2];
  }
  if (yy_accept[(int)uVar1] != 0) {
    yy_last_accepting_state = uVar1;
    yy_last_accepting_cpos = (char *)pbVar2;
  }
  do {
    do {
      lVar4 = (long)yy_base[(int)uVar1] + (ulong)bVar3;
      if (uVar1 == (int)yy_chk[lVar4]) {
        uVar1 = (uint)yy_nxt[lVar4];
        pbVar2 = pbVar2 + 1;
        goto LAB_002ca18d;
      }
      uVar1 = (uint)yy_def[(int)uVar1];
    } while ((int)uVar1 < 0x155);
    bVar3 = ""[bVar3];
  } while( true );
}

Assistant:

static yy_state_type yy_get_previous_state (void)
{
	yy_state_type yy_current_state;
	char *yy_cp;
    
	yy_current_state = (yy_start);

	for ( yy_cp = (yytext_ptr) + YY_MORE_ADJ; yy_cp < (yy_c_buf_p); ++yy_cp )
		{
		YY_CHAR yy_c = (*yy_cp ? yy_ec[YY_SC_TO_UI(*yy_cp)] : 1);
		if ( yy_accept[yy_current_state] )
			{
			(yy_last_accepting_state) = yy_current_state;
			(yy_last_accepting_cpos) = yy_cp;
			}
		while ( yy_chk[yy_base[yy_current_state] + yy_c] != yy_current_state )
			{
			yy_current_state = (int) yy_def[yy_current_state];
			if ( yy_current_state >= 341 )
				yy_c = yy_meta[yy_c];
			}
		yy_current_state = yy_nxt[yy_base[yy_current_state] + yy_c];
		}

	return yy_current_state;
}